

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_test.cc
# Opt level: O2

void re2::SetUnanchored(void)

{
  bool bVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> v;
  LogMessageFatal local_1e0;
  Set s;
  
  RE2::Options::Options((Options *)&local_1e0,DefaultOptions);
  RE2::Set::Set(&s,(Options *)&local_1e0,UNANCHORED);
  local_1e0.super_LogMessage._0_8_ = "foo";
  local_1e0.super_LogMessage._8_4_ = 3;
  iVar2 = RE2::Set::Add(&s,(StringPiece *)&local_1e0,(string *)0x0);
  if (iVar2 != 0) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x12);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,
                    "Check failed: (s.Add(\"foo\", __null)) == (0)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  local_1e0.super_LogMessage._0_8_ = "(";
  local_1e0.super_LogMessage._8_4_ = 1;
  iVar2 = RE2::Set::Add(&s,(StringPiece *)&local_1e0,(string *)0x0);
  if (iVar2 != -1) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x13);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,
                    "Check failed: (s.Add(\"(\", __null)) == (-1)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  local_1e0.super_LogMessage._0_8_ = "bar";
  local_1e0.super_LogMessage._8_4_ = 3;
  iVar2 = RE2::Set::Add(&s,(StringPiece *)&local_1e0,(string *)0x0);
  if (iVar2 != 1) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x14);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,
                    "Check failed: (s.Add(\"bar\", __null)) == (1)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  bVar1 = RE2::Set::Compile(&s);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x15);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,
                    "Check failed: (s.Compile()) == (true)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  local_1e0.super_LogMessage._0_8_ = "foobar";
  local_1e0.super_LogMessage._8_4_ = 6;
  bVar1 = RE2::Set::Match(&s,(StringPiece *)&local_1e0,(vector<int,_std::allocator<int>_> *)0x0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x17);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,
                    "Check failed: (s.Match(\"foobar\", __null)) == (true)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  local_1e0.super_LogMessage._0_8_ = "fooba";
  local_1e0.super_LogMessage._8_4_ = 5;
  bVar1 = RE2::Set::Match(&s,(StringPiece *)&local_1e0,(vector<int,_std::allocator<int>_> *)0x0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x18);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,
                    "Check failed: (s.Match(\"fooba\", __null)) == (true)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  local_1e0.super_LogMessage._0_8_ = "oobar";
  local_1e0.super_LogMessage._8_4_ = 5;
  bVar1 = RE2::Set::Match(&s,(StringPiece *)&local_1e0,(vector<int,_std::allocator<int>_> *)0x0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x19);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,
                    "Check failed: (s.Match(\"oobar\", __null)) == (true)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_1e0.super_LogMessage._0_8_ = "foobar";
  local_1e0.super_LogMessage._8_4_ = 6;
  bVar1 = RE2::Set::Match(&s,(StringPiece *)&local_1e0,&v);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x1c);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,
                    "Check failed: (s.Match(\"foobar\", &v)) == (true)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  if ((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != 8) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x1d);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,"Check failed: (v.size()) == (2)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  if (*v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start != 0
     ) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x1e);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,"Check failed: (v[0]) == (0)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[1] !=
      1) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x1f);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,"Check failed: (v[1]) == (1)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  local_1e0.super_LogMessage._0_8_ = "fooba";
  local_1e0.super_LogMessage._8_4_ = 5;
  bVar1 = RE2::Set::Match(&s,(StringPiece *)&local_1e0,&v);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x21);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,
                    "Check failed: (s.Match(\"fooba\", &v)) == (true)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  if ((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != 4) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x22);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,"Check failed: (v.size()) == (1)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  if (*v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start != 0
     ) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x23);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,"Check failed: (v[0]) == (0)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  local_1e0.super_LogMessage._0_8_ = "oobar";
  local_1e0.super_LogMessage._8_4_ = 5;
  bVar1 = RE2::Set::Match(&s,(StringPiece *)&local_1e0,&v);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x25);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,
                    "Check failed: (s.Match(\"oobar\", &v)) == (true)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  if ((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != 4) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x26);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,"Check failed: (v.size()) == (1)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  if (*v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start != 1
     ) {
    LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x27);
    std::operator<<((ostream *)&local_1e0.super_LogMessage.str_,"Check failed: (v[0]) == (1)");
    LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  RE2::Set::~Set(&s);
  return;
}

Assistant:

TEST(Set, Unanchored) {
  RE2::Set s(RE2::DefaultOptions, RE2::UNANCHORED);

  CHECK_EQ(s.Add("foo", NULL), 0);
  CHECK_EQ(s.Add("(", NULL), -1);
  CHECK_EQ(s.Add("bar", NULL), 1);
  CHECK_EQ(s.Compile(), true);

  CHECK_EQ(s.Match("foobar", NULL), true);
  CHECK_EQ(s.Match("fooba", NULL), true);
  CHECK_EQ(s.Match("oobar", NULL), true);

  vector<int> v;
  CHECK_EQ(s.Match("foobar", &v), true);
  CHECK_EQ(v.size(), 2);
  CHECK_EQ(v[0], 0);
  CHECK_EQ(v[1], 1);

  CHECK_EQ(s.Match("fooba", &v), true);
  CHECK_EQ(v.size(), 1);
  CHECK_EQ(v[0], 0);

  CHECK_EQ(s.Match("oobar", &v), true);
  CHECK_EQ(v.size(), 1);
  CHECK_EQ(v[0], 1);
}